

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void __thiscall
ExpressionContext::ExpressionContext
          (ExpressionContext *this,Allocator *allocator,int optimizationLevel)

{
  uint uVar1;
  SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U> *this_00;
  SmallDenseSet<TypePair,_TypePairHasher,_4U> *pSVar2;
  uint local_38;
  uint local_34;
  uint i_2;
  uint i_1;
  uint i;
  int optimizationLevel_local;
  Allocator *allocator_local;
  ExpressionContext *this_local;
  
  this->optimizationLevel = optimizationLevel;
  SmallArray<ModuleData_*,_128U>::SmallArray(&this->uniqueDependencies,(Allocator *)0x0);
  SmallDenseMap<InplaceStr,_ModuleData_*,_InplaceStrHasher,_128U>::SmallDenseMap
            (&this->uniqueDependencyMap,(Allocator *)0x0);
  SmallArray<ModuleData_*,_128U>::SmallArray(&this->imports,(Allocator *)0x0);
  SmallArray<ModuleData_*,_128U>::SmallArray(&this->implicitImports,(Allocator *)0x0);
  SmallArray<NamespaceData_*,_128U>::SmallArray(&this->namespaces,(Allocator *)0x0);
  SmallArray<TypeBase_*,_128U>::SmallArray(&this->types,(Allocator *)0x0);
  SmallArray<FunctionData_*,_128U>::SmallArray(&this->functions,(Allocator *)0x0);
  SmallArray<VariableData_*,_128U>::SmallArray(&this->variables,(Allocator *)0x0);
  SmallArray<ExprBase_*,_128U>::SmallArray(&this->definitions,(Allocator *)0x0);
  SmallArray<ExprBase_*,_128U>::SmallArray(&this->setup,(Allocator *)0x0);
  SmallArray<VariableData_*,_128U>::SmallArray(&this->vtables,(Allocator *)0x0);
  SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::SmallDenseMap
            (&this->vtableMap,(Allocator *)0x0);
  SmallArray<VariableData_*,_128U>::SmallArray(&this->upvalues,(Allocator *)0x0);
  SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::SmallDenseMap
            (&this->upvalueMap,(Allocator *)0x0);
  SmallArray<TypeFunction_*,_128U>::SmallArray(&this->functionTypes,(Allocator *)0x0);
  SmallArray<TypeFunctionSet_*,_128U>::SmallArray(&this->functionSetTypes,(Allocator *)0x0);
  SmallArray<TypeGenericAlias_*,_128U>::SmallArray(&this->genericAliasTypes,(Allocator *)0x0);
  SmallArray<TypeGenericClass_*,_128U>::SmallArray(&this->genericClassTypes,(Allocator *)0x0);
  HashMap<TypeClass_*>::HashMap(&this->genericTypeMap,(Allocator *)0x0);
  SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
  ::SmallDenseMap(&this->genericFunctionInstanceTypeMap,(Allocator *)0x0);
  SmallDenseSet<TypePair,_TypePairHasher,_32U>::SmallDenseSet
            (&this->noAssignmentOperatorForTypePair,(Allocator *)0x0);
  SmallDenseSet<TypePair,_TypePairHasher,_32U>::SmallDenseSet
            (&this->noIndexOperatorForTypePair,(Allocator *)0x0);
  FixedArray<SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>,_4U>::FixedArray
            (&this->noUnaryOperatorForTypePair);
  FixedArray<SmallDenseSet<TypePair,_TypePairHasher,_4U>,_21U>::FixedArray
            (&this->noBinaryOperatorForTypePair);
  FixedArray<SmallDenseSet<TypePair,_TypePairHasher,_4U>,_11U>::FixedArray
            (&this->noModifyOperatorForTypePair);
  SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>::
  SmallDenseMap(&this->newConstructorFunctions,(Allocator *)0x0);
  SmallArray<NamespaceData_*,_2U>::SmallArray(&this->globalNamespaces,(Allocator *)0x0);
  IntrusiveList<CloseUpvaluesData>::IntrusiveList(&this->globalCloseUpvalues);
  SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U>::SmallDenseMap
            (&this->internalTypeMap,(Allocator *)0x0);
  DirectChainedMap<TypeFunction_*>::DirectChainedMap(&this->functionTypeMap,allocator);
  SmallArray<ErrorInfo_*,_4U>::SmallArray(&this->errorInfo,(Allocator *)0x0);
  CompilerStatistics::CompilerStatistics(&this->statistics);
  this->allocator = allocator;
  this->code = (char *)0x0;
  this->codeEnd = (char *)0x0;
  this->moduleRoot = (char *)0x0;
  this->baseModuleFunctionCount = 0;
  SmallArray<ModuleData_*,_128U>::set_allocator(&this->uniqueDependencies,allocator);
  SmallDenseMap<InplaceStr,_ModuleData_*,_InplaceStrHasher,_128U>::set_allocator
            (&this->uniqueDependencyMap,allocator);
  SmallArray<ModuleData_*,_128U>::set_allocator(&this->imports,allocator);
  SmallArray<ModuleData_*,_128U>::set_allocator(&this->implicitImports,allocator);
  SmallArray<NamespaceData_*,_128U>::set_allocator(&this->namespaces,allocator);
  SmallArray<TypeBase_*,_128U>::set_allocator(&this->types,allocator);
  SmallArray<FunctionData_*,_128U>::set_allocator(&this->functions,allocator);
  SmallArray<VariableData_*,_128U>::set_allocator(&this->variables,allocator);
  SmallArray<ExprBase_*,_128U>::set_allocator(&this->definitions,allocator);
  SmallArray<ExprBase_*,_128U>::set_allocator(&this->setup,allocator);
  SmallArray<VariableData_*,_128U>::set_allocator(&this->vtables,allocator);
  SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::set_allocator
            (&this->vtableMap,allocator);
  SmallArray<VariableData_*,_128U>::set_allocator(&this->upvalues,allocator);
  SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::set_allocator
            (&this->upvalueMap,allocator);
  SmallArray<TypeFunction_*,_128U>::set_allocator(&this->functionTypes,allocator);
  SmallArray<TypeFunctionSet_*,_128U>::set_allocator(&this->functionSetTypes,allocator);
  SmallArray<TypeGenericAlias_*,_128U>::set_allocator(&this->genericAliasTypes,allocator);
  SmallArray<TypeGenericClass_*,_128U>::set_allocator(&this->genericClassTypes,allocator);
  HashMap<TypeClass_*>::set_allocator(&this->genericTypeMap,allocator);
  SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
  ::set_allocator(&this->genericFunctionInstanceTypeMap,allocator);
  SmallDenseSet<TypePair,_TypePairHasher,_32U>::set_allocator
            (&this->noAssignmentOperatorForTypePair,allocator);
  SmallDenseSet<TypePair,_TypePairHasher,_32U>::set_allocator
            (&this->noIndexOperatorForTypePair,allocator);
  i_2 = 0;
  while( true ) {
    uVar1 = FixedArray<SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>,_4U>::size
                      (&this->noUnaryOperatorForTypePair);
    if (uVar1 <= i_2) break;
    this_00 = FixedArray<SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>,_4U>::operator[]
                        (&this->noUnaryOperatorForTypePair,i_2);
    SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>::set_allocator(this_00,allocator);
    i_2 = i_2 + 1;
  }
  local_34 = 0;
  while( true ) {
    uVar1 = FixedArray<SmallDenseSet<TypePair,_TypePairHasher,_4U>,_21U>::size
                      (&this->noBinaryOperatorForTypePair);
    if (uVar1 <= local_34) break;
    pSVar2 = FixedArray<SmallDenseSet<TypePair,_TypePairHasher,_4U>,_21U>::operator[]
                       (&this->noBinaryOperatorForTypePair,local_34);
    SmallDenseSet<TypePair,_TypePairHasher,_4U>::set_allocator(pSVar2,allocator);
    local_34 = local_34 + 1;
  }
  local_38 = 0;
  while( true ) {
    uVar1 = FixedArray<SmallDenseSet<TypePair,_TypePairHasher,_4U>,_11U>::size
                      (&this->noModifyOperatorForTypePair);
    if (uVar1 <= local_38) break;
    pSVar2 = FixedArray<SmallDenseSet<TypePair,_TypePairHasher,_4U>,_11U>::operator[]
                       (&this->noModifyOperatorForTypePair,local_38);
    SmallDenseSet<TypePair,_TypePairHasher,_4U>::set_allocator(pSVar2,allocator);
    local_38 = local_38 + 1;
  }
  SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>::
  set_allocator(&this->newConstructorFunctions,allocator);
  SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U>::set_allocator
            (&this->internalTypeMap,allocator);
  this->errorHandlerActive = false;
  this->errorHandlerNested = false;
  this->errorPos = (char *)0x0;
  this->errorCount = 0;
  this->errorBuf = (char *)0x0;
  this->errorBufSize = 0;
  this->errorBufLocation = (char *)0x0;
  SmallArray<ErrorInfo_*,_4U>::set_allocator(&this->errorInfo,allocator);
  this->typeVoid = (TypeBase *)0x0;
  this->typeBool = (TypeBase *)0x0;
  this->typeChar = (TypeBase *)0x0;
  this->typeShort = (TypeBase *)0x0;
  this->typeInt = (TypeBase *)0x0;
  this->typeLong = (TypeBase *)0x0;
  this->typeFloat = (TypeBase *)0x0;
  this->typeDouble = (TypeBase *)0x0;
  this->typeTypeID = (TypeBase *)0x0;
  this->typeFunctionID = (TypeBase *)0x0;
  this->typeNullPtr = (TypeBase *)0x0;
  this->typeGeneric = (TypeBase *)0x0;
  this->typeAuto = (TypeBase *)0x0;
  this->typeAutoRef = (TypeStruct *)0x0;
  this->typeAutoArray = (TypeStruct *)0x0;
  this->scope = (ScopeData *)0x0;
  this->lookupLocation = (SynBase *)0x0;
  this->globalScope = (ScopeData *)0x0;
  SmallArray<NamespaceData_*,_2U>::set_allocator(&this->globalNamespaces,allocator);
  this->functionInstanceDepth = 0;
  this->classInstanceDepth = 0;
  this->expressionDepth = 0;
  this->memoryLimit = 0;
  HashMap<TypeClass_*>::init(&this->genericTypeMap,(EVP_PKEY_CTX *)allocator);
  this->uniqueNamespaceId = 0;
  this->uniqueVariableId = 0;
  this->uniqueFunctionId = 0;
  this->uniqueAliasId = 0;
  this->uniqueScopeId = 0;
  this->unnamedFuncCount = 0;
  this->unnamedVariableCount = 0;
  return;
}

Assistant:

ExpressionContext::ExpressionContext(Allocator *allocator, int optimizationLevel): optimizationLevel(optimizationLevel), functionTypeMap(allocator), allocator(allocator)
{
	code = NULL;
	codeEnd = NULL;

	moduleRoot = NULL;

	baseModuleFunctionCount = 0;

	uniqueDependencies.set_allocator(allocator);
	uniqueDependencyMap.set_allocator(allocator);

	imports.set_allocator(allocator);
	implicitImports.set_allocator(allocator);
	namespaces.set_allocator(allocator);
	types.set_allocator(allocator);
	functions.set_allocator(allocator);
	variables.set_allocator(allocator);

	definitions.set_allocator(allocator);
	setup.set_allocator(allocator);

	vtables.set_allocator(allocator);
	vtableMap.set_allocator(allocator);

	upvalues.set_allocator(allocator);
	upvalueMap.set_allocator(allocator);

	functionTypes.set_allocator(allocator);
	functionSetTypes.set_allocator(allocator);
	genericAliasTypes.set_allocator(allocator);
	genericClassTypes.set_allocator(allocator);

	genericTypeMap.set_allocator(allocator);

	genericFunctionInstanceTypeMap.set_allocator(allocator);

	noAssignmentOperatorForTypePair.set_allocator(allocator);

	noIndexOperatorForTypePair.set_allocator(allocator);

	for(unsigned i = 0; i < noUnaryOperatorForTypePair.size(); i++)
		noUnaryOperatorForTypePair[i].set_allocator(allocator);

	for(unsigned i = 0; i < noBinaryOperatorForTypePair.size(); i++)
		noBinaryOperatorForTypePair[i].set_allocator(allocator);

	for(unsigned i = 0; i < noModifyOperatorForTypePair.size(); i++)
		noModifyOperatorForTypePair[i].set_allocator(allocator);

	newConstructorFunctions.set_allocator(allocator);

	internalTypeMap.set_allocator(allocator);

	errorHandlerActive = false;
	errorHandlerNested = false;
	errorPos = NULL;
	errorCount = 0;
	errorBuf = NULL;
	errorBufSize = 0;
	errorBufLocation = NULL;

	errorInfo.set_allocator(allocator);

	typeVoid = NULL;

	typeBool = NULL;

	typeChar = NULL;
	typeShort = NULL;
	typeInt = NULL;
	typeLong = NULL;

	typeFloat = NULL;
	typeDouble = NULL;

	typeTypeID = NULL;
	typeFunctionID = NULL;
	typeNullPtr = NULL;

	typeGeneric = NULL;

	typeAuto = NULL;
	typeAutoRef = NULL;
	typeAutoArray = NULL;

	scope = NULL;
	lookupLocation = NULL;

	globalScope = NULL;
	globalNamespaces.set_allocator(allocator);

	functionInstanceDepth = 0;
	classInstanceDepth = 0;
	expressionDepth = 0;

	memoryLimit = 0;

	genericTypeMap.init();

	uniqueNamespaceId = 0;
	uniqueVariableId = 0;
	uniqueFunctionId = 0;
	uniqueAliasId = 0;
	uniqueScopeId = 0;

	unnamedFuncCount = 0;
	unnamedVariableCount = 0;
}